

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2_builder.cpp
# Opt level: O0

void setIndex2Entry(UNewTrie2 *trie,int32_t i2,int32_t block)

{
  int block_00;
  int iVar1;
  int iVar2;
  int32_t oldBlock;
  int32_t block_local;
  int32_t i2_local;
  UNewTrie2 *trie_local;
  
  trie->map[block >> 5] = trie->map[block >> 5] + 1;
  block_00 = trie->index2[i2];
  iVar1 = block_00 >> 5;
  iVar2 = trie->map[iVar1] + -1;
  trie->map[iVar1] = iVar2;
  if (iVar2 == 0) {
    releaseDataBlock(trie,block_00);
  }
  trie->index2[i2] = block;
  return;
}

Assistant:

static inline void
setIndex2Entry(UNewTrie2 *trie, int32_t i2, int32_t block) {
    int32_t oldBlock;
    ++trie->map[block>>UTRIE2_SHIFT_2];  /* increment first, in case block==oldBlock! */
    oldBlock=trie->index2[i2];
    if(0 == --trie->map[oldBlock>>UTRIE2_SHIFT_2]) {
        releaseDataBlock(trie, oldBlock);
    }
    trie->index2[i2]=block;
}